

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.cpp
# Opt level: O2

void __thiscall lzham::task_pool::deinit(task_pool *this)

{
  uint i;
  ulong uVar1;
  
  if (this->m_num_threads != 0) {
    join(this);
    LOCK();
    this->m_exit_flag = 1;
    UNLOCK();
    semaphore::release(&this->m_tasks_available,(ulong)this->m_num_threads);
    for (uVar1 = 0; uVar1 < this->m_num_threads; uVar1 = uVar1 + 1) {
      pthread_join(this->m_threads[uVar1],(void **)0x0);
    }
    this->m_num_threads = 0;
    LOCK();
    this->m_exit_flag = 0;
    UNLOCK();
  }
  tsstack<lzham::task_pool::task,_16U>::clear(&this->m_task_stack);
  this->m_num_outstanding_tasks = 0;
  return;
}

Assistant:

void task_pool::deinit()
   {
      if (m_num_threads)
      {
         join();

         atomic_exchange32(&m_exit_flag, true);

         m_tasks_available.release(m_num_threads);

         for (uint i = 0; i < m_num_threads; i++)
            pthread_join(m_threads[i], NULL);

         m_num_threads = 0;

         atomic_exchange32(&m_exit_flag, false);
      }

      m_task_stack.clear();
      m_num_outstanding_tasks = 0;
   }